

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<unsigned_int>::loadFromIterator<Kernel::FormulaVarIterator>
          (Stack<unsigned_int> *this,FormulaVarIterator *it)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  
  while( true ) {
    bVar2 = Kernel::FormulaVarIterator::hasNext(it);
    if (!bVar2) break;
    uVar3 = Kernel::FormulaVarIterator::next(it);
    if (this->_cursor == this->_end) {
      expand(this);
    }
    puVar1 = this->_cursor;
    *puVar1 = uVar3;
    this->_cursor = puVar1 + 1;
  }
  return;
}

Assistant:

void loadFromIterator(It it) {
    // TODO check iterator.size() or iterator.sizeHint()
    while(it.hasNext()) {
      push(it.next());
    }
  }